

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O0

Status * __thiscall
draco::PlyDecoder::DecodeFromFile(PlyDecoder *this,string *file_name,PointCloud *out_point_cloud)

{
  undefined1 uVar1;
  PlyDecoder *in_RSI;
  PointCloud *in_RDI;
  vector<char,_std::allocator<char>_> data;
  undefined4 in_stack_ffffffffffffff48;
  Code in_stack_ffffffffffffff4c;
  Status *in_stack_ffffffffffffff50;
  DecoderBuffer *pDVar2;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  PointCloud *buffer;
  undefined7 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  string local_68 [48];
  DecoderBuffer local_38;
  
  pDVar2 = &local_38;
  buffer = in_RDI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x12f4f3);
  uVar1 = ReadFileToBuffer((string *)in_RDI,in_stack_ffffffffffffff60);
  if ((bool)uVar1) {
    pDVar2 = &local_38;
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x12f5d0);
    std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)pDVar2);
    DecoderBuffer::Init(pDVar2,(char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                        ,0x12f5f1);
    DecodeFromBuffer(in_RSI,(DecoderBuffer *)buffer,in_RDI);
  }
  else {
    in_stack_ffffffffffffff60 = (vector<char,_std::allocator<char>_> *)&stack0xffffffffffffff97;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)CONCAT17(uVar1,in_stack_ffffffffffffff88),(allocator<char> *)pDVar2);
    Status::Status(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,(string *)0x12f554);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  }
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff60);
  return (Status *)buffer;
}

Assistant:

Status PlyDecoder::DecodeFromFile(const std::string &file_name,
                                  PointCloud *out_point_cloud) {
  std::vector<char> data;
  if (!ReadFileToBuffer(file_name, &data)) {
    return Status(Status::DRACO_ERROR, "Unable to read input file.");
  }
  buffer_.Init(data.data(), data.size());
  return DecodeFromBuffer(&buffer_, out_point_cloud);
}